

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void synthetic_create_rec(stagewise_poly *poly,float v,uint64_t findex)

{
  size_t *psVar1;
  feature *pfVar2;
  vw *pvVar3;
  uint64_t uVar4;
  float fVar5;
  undefined4 uVar6;
  byte bVar7;
  bool bVar8;
  uint64_t uVar9;
  uint uVar10;
  uint64_t *puVar11;
  float v_00;
  feature parent_f;
  
  uVar9 = un_ft_offset(poly,findex);
  pvVar3 = poly->all;
  puVar11 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar11 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  uVar9 = child_wid(poly,uVar9 & *puVar11,(poly->synth_rec_f).weight_index);
  uVar10 = poly->cur_depth;
  bVar7 = min_depths_get(poly,uVar9);
  if ((uVar10 < bVar7) && (poly->training == true)) {
    bVar8 = parent_get(poly,uVar9);
    if (bVar8) {
      parent_toggle(poly,uVar9);
    }
    min_depths_set(poly,uVar9,(uint8_t)poly->cur_depth);
  }
  bVar8 = cycle_get(poly,uVar9);
  if (!bVar8) {
    uVar10 = 0x7f;
    if (poly->cur_depth < 0x7f) {
      uVar10 = poly->cur_depth;
    }
    bVar7 = min_depths_get(poly,uVar9);
    if (uVar10 == bVar7) {
      cycle_toggle(poly,uVar9);
      v_00 = v * (poly->synth_rec_f).x;
      features::push_back((poly->synth_ec).super_example_predict.feature_space + 0x86,v_00,uVar9);
      psVar1 = &(poly->synth_ec).num_features;
      *psVar1 = *psVar1 + 1;
      bVar8 = parent_get(poly,uVar9);
      if (bVar8) {
        pfVar2 = &poly->synth_rec_f;
        fVar5 = pfVar2->x;
        uVar6 = *(undefined4 *)&pfVar2->field_0x4;
        uVar4 = (poly->synth_rec_f).weight_index;
        (poly->synth_rec_f).x = v_00;
        (poly->synth_rec_f).weight_index = uVar9;
        poly->cur_depth = poly->cur_depth + 1;
        GD::foreach_feature<stagewise_poly,_unsigned_long,_&synthetic_create_rec>
                  (poly->all,poly->original_ec,poly);
        poly->cur_depth = poly->cur_depth - 1;
        pfVar2->x = fVar5;
        *(undefined4 *)&pfVar2->field_0x4 = uVar6;
        (poly->synth_rec_f).weight_index = uVar4;
      }
    }
  }
  return;
}

Assistant:

void synthetic_create_rec(stagewise_poly &poly, float v, uint64_t findex)
{
  // Note: need to un_ft_shift since gd::foreach_feature bakes in the offset.
  uint64_t wid_atomic = wid_mask(poly, un_ft_offset(poly, findex));
  uint64_t wid_cur = child_wid(poly, wid_atomic, poly.synth_rec_f.weight_index);
  assert(wid_atomic % stride_shift(poly, 1) == 0);

  // Note: only mutate learner state when in training mode.  This is because
  // the average test errors across multiple data sets should be equal to
  // the test error on the merged dataset (which is violated if the code
  // below is run at training time).
  if (poly.cur_depth < min_depths_get(poly, wid_cur) && poly.training)
  {
    if (parent_get(poly, wid_cur))
    {
#ifdef DEBUG
      cout << "FOUND A TRANSPLANT!!! moving [" << wid_cur << "] from depth " << (uint64_t)min_depths_get(poly, wid_cur)
           << " to depth " << poly.cur_depth << endl;
#endif  // DEBUG
      // XXX arguably, should also fear transplants that occured with
      // a different ft_offset ; e.g., need to look out for cross-reduction
      // collisions.  Have not played with this issue yet...
      parent_toggle(poly, wid_cur);
    }
    min_depths_set(poly, wid_cur, poly.cur_depth);
  }

  if (!cycle_get(poly, wid_cur) &&
      ((poly.cur_depth > default_depth ? default_depth : poly.cur_depth) == min_depths_get(poly, wid_cur)))
  {
    cycle_toggle(poly, wid_cur);

#ifdef DEBUG
    ++poly.depths[poly.cur_depth];
#endif  // DEBUG

    feature temp = {v * poly.synth_rec_f.x, wid_cur};
    poly.synth_ec.feature_space[tree_atomics].push_back(temp.x, temp.weight_index);
    poly.synth_ec.num_features++;

    if (parent_get(poly, temp.weight_index))
    {
      feature parent_f = poly.synth_rec_f;
      poly.synth_rec_f = temp;
      ++poly.cur_depth;
#ifdef DEBUG
      poly.max_depth = (poly.max_depth > poly.cur_depth) ? poly.max_depth : poly.cur_depth;
#endif  // DEBUG
      GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*(poly.all), *(poly.original_ec), poly);
      --poly.cur_depth;
      poly.synth_rec_f = parent_f;
    }
  }
}